

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.hpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderPerformanceMeasurer::~ShaderPerformanceMeasurer(ShaderPerformanceMeasurer *this)

{
  ShaderPerformanceMeasurer *this_local;
  
  deinit(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_attribBuffers);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::~vector
            (&this->m_attributes);
  TheilSenCalibrator::~TheilSenCalibrator(&this->m_calibrator);
  return;
}

Assistant:

~ShaderPerformanceMeasurer	(void) { deinit(); }